

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

KeyFrameListList * __thiscall
Assimp::FBX::FBXConverter::GetKeyframeList
          (KeyFrameListList *__return_storage_ptr__,FBXConverter *this,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *nodes,int64_t start,int64_t stop)

{
  _Base_ptr __lhs;
  pointer ppAVar1;
  long lVar2;
  element_type *this_00;
  bool bVar3;
  pointer ppAVar4;
  AnimationCurveMap *pAVar5;
  long lVar6;
  vector<long,_std::allocator<long>_> *__p;
  vector<float,_std::allocator<float>_> *__p_00;
  const_reference pvVar7;
  const_reference __x;
  _Base_ptr p_Var8;
  size_t n;
  size_type __n;
  size_type __n_00;
  uint mapto;
  _Base_ptr local_a8;
  vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
  *local_a0;
  shared_ptr<std::vector<float,_std::allocator<float>_>_> Values;
  shared_ptr<std::vector<long,_std::allocator<long>_>_> Keys;
  int64_t k;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = (vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
              *)__return_storage_ptr__;
  std::
  vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
  ::reserve(__return_storage_ptr__,
            ((long)(nodes->
                   super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(nodes->
                   super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) * 3);
  ppAVar4 = (nodes->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (nodes->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppAVar4 == ppAVar1) {
      return (KeyFrameListList *)local_a0;
    }
    if (*ppAVar4 == (AnimationCurveNode *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                    ,0xc92,
                    "FBXConverter::KeyFrameListList Assimp::FBX::FBXConverter::GetKeyframeList(const std::vector<const AnimationCurveNode *> &, int64_t, int64_t)"
                   );
    }
    pAVar5 = AnimationCurveNode::Curves_abi_cxx11_(*ppAVar4);
    p_Var8 = (pAVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var8 != &(pAVar5->_M_t)._M_impl.super__Rb_tree_header) {
      __lhs = p_Var8 + 1;
      local_a8 = p_Var8;
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"d|X");
      if (bVar3) {
        mapto = 0;
LAB_00508305:
        lVar2 = *(long *)(local_a8 + 2);
        lVar6 = *(long *)(lVar2 + 0x40) - *(long *)(lVar2 + 0x38);
        if ((lVar6 == 0) || (lVar6 >> 3 != *(long *)(lVar2 + 0x58) - *(long *)(lVar2 + 0x50) >> 2))
        {
          __assert_fail("curve->GetKeys().size() == curve->GetValues().size() && curve->GetKeys().size()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                        ,0xca7,
                        "FBXConverter::KeyFrameListList Assimp::FBX::FBXConverter::GetKeyframeList(const std::vector<const AnimationCurveNode *> &, int64_t, int64_t)"
                       );
        }
        __p = (vector<long,_std::allocator<long>_> *)operator_new(0x18);
        (__p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (__p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        (__p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::__shared_ptr<std::vector<long,std::allocator<long>>,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::vector<long,std::allocator<long>>,void>
                  ((__shared_ptr<std::vector<long,std::allocator<long>>,(__gnu_cxx::_Lock_policy)2>
                    *)&Keys,__p);
        __p_00 = (vector<float,_std::allocator<float>_> *)operator_new(0x18);
        (__p_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (__p_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        (__p_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::__shared_ptr<std::vector<float,std::allocator<float>>,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::vector<float,std::allocator<float>>,void>
                  ((__shared_ptr<std::vector<float,std::allocator<float>>,(__gnu_cxx::_Lock_policy)2>
                    *)&Values,__p_00);
        __n_00 = *(long *)(lVar2 + 0x40) - *(long *)(lVar2 + 0x38) >> 3;
        std::vector<long,_std::allocator<long>_>::reserve
                  (Keys.
                   super___shared_ptr<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,__n_00);
        std::vector<float,_std::allocator<float>_>::reserve
                  (Values.
                   super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,__n_00);
        for (__n = 0; __n_00 != __n; __n = __n + 1) {
          pvVar7 = std::vector<long,_std::allocator<long>_>::at
                             ((vector<long,_std::allocator<long>_> *)(lVar2 + 0x38),__n);
          k = *pvVar7;
          if (k <= stop + 10000 && start + -10000 <= k) {
            std::vector<long,_std::allocator<long>_>::push_back
                      (Keys.
                       super___shared_ptr<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&k);
            this_00 = Values.
                      super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            __x = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)(lVar2 + 0x50),__n);
            std::vector<float,_std::allocator<float>_>::push_back(this_00,__x);
          }
        }
        std::
        tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
        ::
        tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>_&,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_&,_unsigned_int_&,_true,_true>
                  ((tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                    *)&k,&Keys,&Values,&mapto);
        std::
        vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
        ::
        emplace_back<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>
                  (local_a0,(tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                             *)&k);
        std::
        _Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
        ::~_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                        *)&k);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&Values.
                    super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&Keys.
                    super___shared_ptr<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"d|Y");
        if (bVar3) {
          mapto = 1;
          goto LAB_00508305;
        }
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"d|Z");
        if (bVar3) {
          mapto = 2;
          goto LAB_00508305;
        }
        LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x508469);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_a8);
    }
    ppAVar4 = ppAVar4 + 1;
  } while( true );
}

Assistant:

FBXConverter::KeyFrameListList FBXConverter::GetKeyframeList(const std::vector<const AnimationCurveNode*>& nodes, int64_t start, int64_t stop)
        {
            KeyFrameListList inputs;
            inputs.reserve(nodes.size() * 3);

            //give some breathing room for rounding errors
            int64_t adj_start = start - 10000;
            int64_t adj_stop = stop + 10000;

            for (const AnimationCurveNode* node : nodes) {
                ai_assert(node);

                const AnimationCurveMap& curves = node->Curves();
                for (const AnimationCurveMap::value_type& kv : curves) {

                    unsigned int mapto;
                    if (kv.first == "d|X") {
                        mapto = 0;
                    }
                    else if (kv.first == "d|Y") {
                        mapto = 1;
                    }
                    else if (kv.first == "d|Z") {
                        mapto = 2;
                    }
                    else {
                        FBXImporter::LogWarn("ignoring scale animation curve, did not recognize target component");
                        continue;
                    }

                    const AnimationCurve* const curve = kv.second;
                    ai_assert(curve->GetKeys().size() == curve->GetValues().size() && curve->GetKeys().size());

                    //get values within the start/stop time window
                    std::shared_ptr<KeyTimeList> Keys(new KeyTimeList());
                    std::shared_ptr<KeyValueList> Values(new KeyValueList());
                    const size_t count = curve->GetKeys().size();
                    Keys->reserve(count);
                    Values->reserve(count);
                    for (size_t n = 0; n < count; n++)
                    {
                        int64_t k = curve->GetKeys().at(n);
                        if (k >= adj_start && k <= adj_stop)
                        {
                            Keys->push_back(k);
                            Values->push_back(curve->GetValues().at(n));
                        }
                    }

                    inputs.push_back(std::make_tuple(Keys, Values, mapto));
                }
            }
            return inputs; // pray for NRVO :-)
        }